

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O0

bool __thiscall Directory::refresh(Directory *this)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  dirent *__lhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  string fullPath;
  stat entryStatus;
  string name;
  bool pushed;
  dirent *entry;
  DIR *dir;
  MutexLocker lock;
  Mutex *in_stack_fffffffffffffe98;
  MutexLocker *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  string local_120 [32];
  stat local_100;
  undefined1 local_69 [40];
  byte local_41;
  dirent *local_40;
  undefined4 local_38;
  DIR *local_28;
  byte local_1;
  
  MutexLocker::MutexLocker(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  *(undefined1 *)
   &in_RDI[1].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x1cea6f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x1cea7d);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_28 = opendir(pcVar2);
  if (local_28 == (DIR *)0x0) {
    uVar3 = std::__cxx11::string::c_str();
    softHSMLog(7,"refresh",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/Directory.cpp"
               ,0x6f,"Failed to open directory %s",uVar3);
    local_1 = 0;
  }
  else {
    local_40 = (dirent *)0x0;
    while (__lhs = readdir(local_28), local_40 = __lhs, __lhs != (dirent *)0x0) {
      local_41 = 0;
      iVar1 = strcmp(__lhs->d_name,".");
      if ((iVar1 != 0) && (iVar1 = strcmp(local_40->d_name,".."), iVar1 != 0)) {
        pcVar2 = local_40->d_name;
        in_stack_fffffffffffffea0 = (MutexLocker *)local_69;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_69 + 1),pcVar2,(allocator *)in_stack_fffffffffffffea0);
        std::allocator<char>::~allocator((allocator<char> *)local_69);
        if ((local_41 & 1) == 0) {
          std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffea0);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffec0);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          iVar1 = lstat(pcVar2,&local_100);
          if (iVar1 == 0) {
            if ((local_100.st_mode & 0xf000) == 0x4000) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(in_RDI,(value_type *)__lhs);
            }
            else if ((local_100.st_mode & 0xf000) == 0x8000) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(in_RDI,(value_type *)__lhs);
            }
            else {
              uVar3 = std::__cxx11::string::c_str();
              softHSMLog(7,"refresh",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/Directory.cpp"
                         ,0xa8,"File not used %s",uVar3);
            }
          }
          std::__cxx11::string::~string(local_120);
        }
        std::__cxx11::string::~string((string *)(local_69 + 1));
      }
    }
    closedir(local_28);
    *(undefined1 *)
     &in_RDI[1].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = 1;
    local_1 = 1;
  }
  local_38 = 1;
  MutexLocker::~MutexLocker(in_stack_fffffffffffffea0);
  return (bool)(local_1 & 1);
}

Assistant:

bool Directory::refresh()
{
	// Prevent concurrent call until valid is reset
	MutexLocker lock(dirMutex);

	// Reset the state
	valid = false;

	subDirs.clear();
	files.clear();

#ifndef _WIN32
	// Enumerate the directory
	DIR* dir = opendir(path.c_str());

	if (dir == NULL)
	{
		DEBUG_MSG("Failed to open directory %s", path.c_str());

		return false;
	}

	// Enumerate the directory
	struct dirent* entry = NULL;

	while ((entry = readdir(dir)) != NULL)
	{
		bool pushed = false;

		// Check if this is the . or .. entry
		if (!strcmp(entry->d_name, ".") || !strcmp(entry->d_name, ".."))
		{
			continue;
		}

		// Convert the name of the entry to a C++ string
		std::string name(entry->d_name);

#if defined(_DIRENT_HAVE_D_TYPE) && defined(_BSD_SOURCE)
		// Determine the type of the entry
		switch(entry->d_type)
		{
		case DT_DIR:
			// This is a directory
			subDirs.push_back(name);
			pushed = true;
			break;
		case DT_REG:
			// This is a regular file
			files.push_back(name);
			pushed = true;
			break;
		default:
			break;
		}
#endif
		if (!pushed) {
			// The entry type has to be determined using lstat
			struct stat entryStatus;

			std::string fullPath = path + OS_PATHSEP + name;

			if (!lstat(fullPath.c_str(), &entryStatus))
			{
				if (S_ISDIR(entryStatus.st_mode))
				{
					subDirs.push_back(name);
				}
				else if (S_ISREG(entryStatus.st_mode))
				{
					files.push_back(name);
				}
				else
				{
					DEBUG_MSG("File not used %s", name.c_str());
				}
			}
		}
	}

	// Close the directory
	closedir(dir);

#else
	// Enumerate the directory
	std::string pattern;
	intptr_t h;
	struct _finddata_t fi;

	if ((path.back() == '/') || (path.back() == '\\'))
		pattern = path + "*";
	else
		pattern = path + "/*";
	memset(&fi, 0, sizeof(fi));
	h = _findfirst(pattern.c_str(), &fi);
	if (h == -1)
	{
		// empty directory
		if (errno == ENOENT)
			goto finished;

		DEBUG_MSG("Failed to open directory %s", path.c_str());

		return false;
	}

	// scan files & subdirs
	do {
		// Check if this is the . or .. entry
		if (!strcmp(fi.name, ".") || !strcmp(fi.name, ".."))
			continue;

		if ((fi.attrib & _A_SUBDIR) == 0)
			files.push_back(fi.name);
		else
			subDirs.push_back(fi.name);

		memset(&fi, 0, sizeof(fi));
	} while (_findnext(h, &fi) == 0);

	(void) _findclose(h);

    finished:
#endif

	valid = true;

	return true;
}